

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  CellInfo *pInfo;
  void *pvVar4;
  int in_ECX;
  uint in_EDX;
  BtCursor *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  Pgno ovfl;
  uchar *newCell;
  uchar *oldCell;
  Btree *p;
  MemPage *pPage;
  int idx;
  CellInfo info_1;
  CellInfo info;
  BtreePayload x2;
  UnpackedRecord r;
  int szNew;
  int loc;
  int rc;
  BtCursor *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  u32 in_stack_ffffffffffffff14;
  BtCursor *pCur_00;
  Pgno parent;
  Btree *pBtree;
  int *piVar5;
  BtShared *pBt;
  undefined4 in_stack_ffffffffffffff38;
  int biasRight;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  UnpackedRecord *in_stack_ffffffffffffff60;
  BtCursor *in_stack_ffffffffffffff68;
  BtreePayload *in_stack_ffffffffffffff70;
  undefined1 *puVar6;
  uchar *in_stack_ffffffffffffff78;
  MemPage *in_stack_ffffffffffffff80;
  undefined1 local_70 [16];
  undefined8 local_60;
  undefined4 local_4c;
  undefined4 local_48;
  undefined8 local_40;
  void *local_38;
  undefined2 local_24;
  undefined1 local_22;
  undefined1 local_1e;
  uint local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = -0x55555556;
  local_14 = 0;
  biasRight = -0x55555556;
  piVar5 = (int *)&DAT_aaaaaaaaaaaaaaaa;
  pBtree = *(Btree **)(in_RDI + 8);
  parent = 0xaaaaaaaa;
  pCur_00 = (BtCursor *)0x0;
  local_10 = in_ECX;
  if ((in_RDI[1] & 0x20) != 0) {
    parent = 0xaaaaaaaa;
    local_c = saveAllCursors((BtShared *)0x0,in_stack_ffffffffffffff14,in_stack_ffffffffffffff08);
    iVar2 = local_c;
    if (local_c != 0) goto LAB_00187de6;
    if ((local_10 != 0) && ((char)in_RDI[0x54] < '\0')) {
      iVar2 = sqlite3CorruptError(0);
      goto LAB_00187de6;
    }
  }
  if (((2 < *in_RDI) && (local_c = moveToRoot(pCur_00), local_c != 0)) &&
     (iVar2 = local_c, local_c != 0x10)) goto LAB_00187de6;
  if (*(long *)(in_RDI + 0x80) == 0) {
    if (pBtree->hasIncrblobCur != '\0') {
      invalidateIncrblobCursors(pBtree,*(Pgno *)(in_RDI + 0x50),(i64)in_RSI->pBtree,0);
    }
    if (((in_RDI[1] & 2) == 0) || (in_RSI->pBtree != *(Btree **)(in_RDI + 0x30))) {
      if (local_10 == 0) {
        iVar2 = sqlite3BtreeTableMoveto(in_RSI,CONCAT44(in_EDX,in_ECX),biasRight,piVar5);
        local_c = iVar2;
        if (iVar2 != 0) goto LAB_00187de6;
        local_c = 0;
      }
    }
    else if ((*(short *)(in_RDI + 0x46) != 0) &&
            (*(int *)(in_RDI + 0x40) == *(int *)((long)&in_RSI->pBt + 4) + *(int *)&in_RSI->pNext))
    {
      iVar2 = btreeOverwriteCell(pCur_00,(BtreePayload *)
                                         CONCAT44(in_stack_ffffffffffffff14,
                                                  in_stack_ffffffffffffff10));
      goto LAB_00187de6;
    }
  }
  else {
    if ((local_10 == 0) && ((in_EDX & 2) == 0)) {
      if (*(short *)&in_RSI->pBt == 0) {
        local_c = btreeMoveto((BtCursor *)CONCAT44(biasRight,in_stack_ffffffffffffff38),piVar5,
                              (i64)pBtree,parent,(int *)pCur_00);
      }
      else {
        memset(&local_40,0xaa,0x28);
        local_40 = *(undefined8 *)(in_RDI + 0x80);
        local_38 = in_RSI->pKey;
        local_24 = *(undefined2 *)&in_RSI->pBt;
        local_22 = 0;
        local_1e = 0;
        local_c = sqlite3BtreeIndexMoveto
                            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                             (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      iVar2 = local_c;
      if (local_c != 0) goto LAB_00187de6;
    }
    if ((local_10 == 0) &&
       (getCellInfo((BtCursor *)0x1877d5), *(Btree **)(in_RDI + 0x30) == in_RSI->pBtree)) {
      memset(local_70,0xaa,0x30);
      local_60._0_1_ = in_RSI->eState;
      local_60._1_1_ = in_RSI->curFlags;
      local_60._2_1_ = in_RSI->curPagerFlags;
      local_60._3_1_ = in_RSI->hints;
      local_60._4_4_ = in_RSI->skipNext;
      local_4c = SUB84(in_RSI->pBtree,0);
      local_48 = 0;
      iVar2 = btreeOverwriteCell(pCur_00,(BtreePayload *)
                                         CONCAT44(in_stack_ffffffffffffff14,
                                                  in_stack_ffffffffffffff10));
      goto LAB_00187de6;
    }
  }
  pBt = *(BtShared **)(in_RDI + 0x88);
  if (*(int *)((long)&pBt->pCursor + 4) < 0) {
    if (*in_RDI < 2) {
      local_c = btreeComputeFreeSpace((MemPage *)CONCAT44(biasRight,in_stack_ffffffffffffff38));
    }
    else {
      local_c = sqlite3CorruptError(0);
    }
    iVar2 = local_c;
    if (local_c != 0) goto LAB_00187de6;
  }
  piVar5 = (int *)pBtree->pBt->pTmpSpace;
  if ((in_EDX & 0x80) == 0) {
    local_c = fillInCell(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                         in_stack_ffffffffffffff70,(int *)in_stack_ffffffffffffff68);
joined_r0x00187a22:
    iVar2 = local_c;
    if (local_c != 0) goto LAB_00187de6;
  }
  else {
    local_c = 0;
    local_14 = pBtree->pBt->nPreformatSize;
    if ((int)local_14 < 4) {
      local_14 = 4;
      *(undefined1 *)((long)piVar5 + 3) = 0;
    }
    if ((pBtree->pBt->autoVacuum != '\0') &&
       ((int)(uint)*(ushort *)((long)&pBt->db + 6) < (int)local_14)) {
      (*(code *)pBt->pWriter)(pBt,piVar5,&stack0xffffffffffffff78);
      in_stack_ffffffffffffff14 = sqlite3Get4byte((u8 *)((long)piVar5 + (long)(int)(local_14 - 4)));
      ptrmapPut(pBt,(Pgno)((ulong)pBtree >> 0x20),(u8)((ulong)pBtree >> 0x18),parent,piVar5);
      goto joined_r0x00187a22;
    }
  }
  uVar3 = (uint)*(ushort *)(in_RDI + 0x56);
  in_RDI[0x46] = 0;
  in_RDI[0x47] = 0;
  if (local_10 == 0) {
    puVar6 = &DAT_aaaaaaaaaaaaaaaa;
    if (*(ushort *)&pBt->pPage1 <= uVar3) {
      iVar2 = sqlite3CorruptError(0);
      goto LAB_00187de6;
    }
    iVar2 = sqlite3PagerWrite((PgHdr *)in_stack_ffffffffffffff08);
    local_c = iVar2;
    if (iVar2 != 0) goto LAB_00187de6;
    pInfo = (CellInfo *)
            (pBt->xFreeSchema +
            (int)(uint)(*(ushort *)((long)&pBt->pPage1 + 2) &
                       CONCAT11(*(undefined1 *)
                                 ((long)&pBt->pHasContent->iSize + (long)(int)(uVar3 << 1)),
                                *(undefined1 *)
                                 ((long)&pBt->pHasContent->iSize + (long)(int)(uVar3 << 1) + 1))));
    if (*(char *)&pBt->db == '\0') {
      *piVar5 = (int)pInfo->nKey;
    }
    (*(code *)pBt->pWriter)(pBt,pInfo,&stack0xffffffffffffff60);
    if ((uint)(ushort)((ulong)puVar6 >> 0x20) == (uint)puVar6) {
      local_c = 0;
    }
    else {
      local_c = clearCellOverflow((MemPage *)pBt,(uchar *)pBtree,pInfo);
    }
    in_RDI[1] = in_RDI[1] & 0xfb;
    if ((((ushort)((ulong)puVar6 >> 0x30) == local_14) &&
        ((uint)(ushort)((ulong)puVar6 >> 0x20) == (uint)puVar6)) &&
       ((pBtree->pBt->autoVacuum == '\0' || ((int)local_14 < (int)(uint)*(ushort *)&pBt->pCursor))))
    {
      if (pInfo < (CellInfo *)
                  (pBt->xFreeSchema + (long)(int)(uint)*(byte *)((long)&pBt->db + 1) + 10)) {
        iVar2 = sqlite3CorruptError(0);
      }
      else if (pBt->mutex < (sqlite3_mutex *)((long)&pInfo->nKey + (long)(int)local_14)) {
        iVar2 = sqlite3CorruptError(0);
      }
      else {
        memcpy(pInfo,piVar5,(long)(int)local_14);
        iVar2 = 0;
      }
      goto LAB_00187de6;
    }
    dropCell((MemPage *)pBt,(int)((ulong)pBtree >> 0x20),(int)pBtree,(int *)pInfo);
    iVar2 = local_c;
    if (local_c != 0) goto LAB_00187de6;
  }
  else if ((local_10 < 0) && (*(short *)&pBt->pPage1 != 0)) {
    sVar1 = *(short *)(in_RDI + 0x56);
    *(ushort *)(in_RDI + 0x56) = sVar1 + 1U;
    uVar3 = (uint)(ushort)(sVar1 + 1U);
    in_RDI[1] = in_RDI[1] & 0xf9;
  }
  local_c = insertCellFast((MemPage *)in_RSI,in_EDX,(u8 *)CONCAT44(uVar3,in_stack_ffffffffffffff38),
                           (int)((ulong)pBt >> 0x20));
  iVar2 = local_c;
  if (*(char *)((long)&pBt->db + 4) != '\0') {
    in_RDI[1] = in_RDI[1] & 0xf9;
    local_c = balance(in_RSI);
    *(undefined1 *)(*(long *)(in_RDI + 0x88) + 0xc) = 0;
    *in_RDI = 1;
    iVar2 = local_c;
    if (((in_EDX & 2) != 0) && (local_c == 0)) {
      btreeReleaseAllCursorPages
                ((BtCursor *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      if (*(long *)(in_RDI + 0x80) != 0) {
        pvVar4 = sqlite3Malloc(CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        *(void **)(in_RDI + 0x18) = pvVar4;
        if (*(long *)(in_RDI + 0x18) == 0) {
          local_c = 7;
        }
        else {
          memcpy(*(void **)(in_RDI + 0x18),*(void **)in_RSI,(size_t)in_RSI->pBtree);
        }
      }
      *in_RDI = 3;
      *(Btree **)(in_RDI + 0x48) = in_RSI->pBtree;
      iVar2 = local_c;
    }
  }
LAB_00187de6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior IndexMoveto() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND|BTREE_PREFORMAT))==flags );
  assert( (flags & BTREE_PREFORMAT)==0 || seekResult || pCur->pKeyInfo==0 );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the
  ** integer key to use. It then calls this function to actually insert the
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(p->pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
    if( loc && pCur->iPage<0 ){
      /* This can only happen if the schema is corrupt such that there is more
      ** than one table or index with the same root page as used by the cursor.
      ** Which can only happen if the SQLITE_NoSchemaError flag was set when
      ** the schema was loaded. This cannot be asserted though, as a user might
      ** set the flag, load the schema, and then unset the flag.  */
      return SQLITE_CORRUPT_PGNO(pCur->pgnoRoot);
    }
  }

  /* Ensure that the cursor is not in the CURSOR_FAULT state and that it
  ** points to a valid cell.
  */
  if( pCur->eState>=CURSOR_REQUIRESEEK ){
    testcase( pCur->eState==CURSOR_REQUIRESEEK );
    testcase( pCur->eState==CURSOR_FAULT );
    rc = moveToRoot(pCur);
    if( rc && rc!=SQLITE_EMPTY ) return rc;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && p->pBt->inTransaction==TRANS_WRITE
              && (p->pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (flags & BTREE_PREFORMAT) || (pX->pKey==0)==(pCur->pKeyInfo==0) );

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob
    ** cursors open on the row being replaced */
    if( p->hasIncrblobCur ){
      invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);
    }

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
#ifdef SQLITE_DEBUG
    if( flags & BTREE_SAVEPOSITION ){
      assert( pCur->curFlags & BTCF_ValidNKey );
      assert( pX->nKey==pCur->info.nKey );
      assert( loc==0 );
    }
#endif

    /* On the other hand, BTREE_SAVEPOSITION==0 does not imply
    ** that the cursor is not pointing to a row to be overwritten.
    ** So do a complete check.
    */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      /* The cursor is pointing to the entry that is to be
      ** overwritten */
      assert( pX->nData>=0 && pX->nZero>=0 );
      if( pCur->info.nSize!=0
       && pCur->info.nPayload==(u32)pX->nData+pX->nZero
      ){
        /* New entry is the same size as the old.  Do an overwrite */
        return btreeOverwriteCell(pCur, pX);
      }
      assert( loc==0 );
    }else if( loc==0 ){
      /* The cursor is *not* pointing to the cell to be overwritten, nor
      ** to an adjacent cell.  Move the cursor so that it is pointing either
      ** to the cell to be overwritten or an adjacent cell.
      */
      rc = sqlite3BtreeTableMoveto(pCur, pX->nKey,
               (flags & BTREE_APPEND)!=0, &loc);
      if( rc ) return rc;
    }
  }else{
    /* This is an index or a WITHOUT ROWID table */

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
    assert( (flags & BTREE_SAVEPOSITION)==0 || loc==0 );

    /* If the cursor is not already pointing either to the cell to be
    ** overwritten, or if a new cell is being inserted, if the cursor is
    ** not pointing to an immediately adjacent cell, then move the cursor
    ** so that it does.
    */
    if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
      if( pX->nMem ){
        UnpackedRecord r;
        r.pKeyInfo = pCur->pKeyInfo;
        r.aMem = pX->aMem;
        r.nField = pX->nMem;
        r.default_rc = 0;
        r.eqSeen = 0;
        rc = sqlite3BtreeIndexMoveto(pCur, &r, &loc);
      }else{
        rc = btreeMoveto(pCur, pX->pKey, pX->nKey,
                    (flags & BTREE_APPEND)!=0, &loc);
      }
      if( rc ) return rc;
    }

    /* If the cursor is currently pointing to an entry to be overwritten
    ** and the new content is the same as as the old, then use the
    ** overwrite optimization.
    */
    if( loc==0 ){
      getCellInfo(pCur);
      if( pCur->info.nKey==pX->nKey ){
        BtreePayload x2;
        x2.pData = pX->pKey;
        x2.nData = pX->nKey;
        x2.nZero = 0;
        return btreeOverwriteCell(pCur, &x2);
      }
    }
  }
  assert( pCur->eState==CURSOR_VALID
       || (pCur->eState==CURSOR_INVALID && loc) || CORRUPT_DB );

  pPage = pCur->pPage;
  assert( pPage->intKey || pX->nKey>=0 || (flags & BTREE_PREFORMAT) );
  assert( pPage->leaf || !pPage->intKey );
  if( pPage->nFree<0 ){
    if( NEVER(pCur->eState>CURSOR_INVALID) ){
     /* ^^^^^--- due to the moveToRoot() call above */
      rc = SQLITE_CORRUPT_PAGE(pPage);
    }else{
      rc = btreeComputeFreeSpace(pPage);
    }
    if( rc ) return rc;
  }

  TRACE(("INSERT: table=%u nkey=%lld ndata=%u page=%u %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit || CORRUPT_DB );
  newCell = p->pBt->pTmpSpace;
  assert( newCell!=0 );
  assert( BTREE_PREFORMAT==OPFLAG_PREFORMAT );
  if( flags & BTREE_PREFORMAT ){
    rc = SQLITE_OK;
    szNew = p->pBt->nPreformatSize;
    if( szNew<4 ){
      szNew = 4;
      newCell[3] = 0;
    }
    if( ISAUTOVACUUM(p->pBt) && szNew>pPage->maxLocal ){
      CellInfo info;
      pPage->xParseCell(pPage, newCell, &info);
      if( info.nPayload!=info.nLocal ){
        Pgno ovfl = get4byte(&newCell[szNew-4]);
        ptrmapPut(p->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, &rc);
        if( NEVER(rc) ) goto end_insert;
      }
    }
  }else{
    rc = fillInCell(pPage, newCell, pX, &szNew);
    if( rc ) goto end_insert;
  }
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(p->pBt) );
  idx = pCur->ix;
  pCur->info.nSize = 0;
  if( loc==0 ){
    CellInfo info;
    assert( idx>=0 );
    if( idx>=pPage->nCell ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    BTREE_CLEAR_CELL(rc, pPage, oldCell, info);
    testcase( pCur->curFlags & BTCF_ValidOvfl );
    invalidateOverflowCache(pCur);
    if( info.nSize==szNew && info.nLocal==info.nPayload
     && (!ISAUTOVACUUM(p->pBt) || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell().
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell < pPage->aData+pPage->hdrOffset+10 ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      if( oldCell+szNew > pPage->aDataEnd ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  }else{
    assert( pPage->leaf );
  }
  rc = insertCellFast(pPage, idx, newCell, szNew);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance()
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise.
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->pPage->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      btreeReleaseAllCursorPages(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->iPage<0 || pCur->pPage->nOverflow==0 );

end_insert:
  return rc;
}